

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O2

bool Function_Template::form2_Sum(SumForm2 Sum)

{
  byte value;
  uint32_t uVar1;
  uint32_t roiHeight;
  uint32_t roiWidth;
  uint32_t roiY;
  uint32_t roiX;
  Image input;
  
  value = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)&roiX,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&input,value,0,0,(ImageTemplate<unsigned_char> *)&roiX);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)&roiX);
  Unit_Test::generateRoi(&input,&roiX,&roiY,&roiWidth,&roiHeight);
  uVar1 = (*Sum)(&input,roiX,roiY,roiWidth,roiHeight);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&input);
  return uVar1 == value * roiWidth * roiHeight;
}

Assistant:

bool form2_Sum(SumForm2 Sum)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image input = uniformImage( intensity );

        uint32_t roiX, roiY, roiWidth, roiHeight;
        generateRoi( input, roiX, roiY, roiWidth, roiHeight );

        return Sum( input, roiX, roiY, roiWidth, roiHeight ) == intensity * roiWidth * roiHeight;
    }